

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

double calcScore(int *bins,int bincount,int keycount)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined8 in_XMM2_Qa;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 extraout_var [56];
  
  auVar2 = ZEXT816(0) << 0x40;
  uVar1 = 0;
  while ((uint)(~(bincount >> 0x1f) & bincount) != uVar1) {
    auVar5._0_8_ = (double)bins[uVar1];
    auVar5._8_8_ = in_XMM2_Qa;
    uVar1 = uVar1 + 1;
    auVar2 = vfmadd231sd_fma(auVar2,auVar5,auVar5);
  }
  dVar7 = (double)bincount;
  auVar8._0_8_ = (double)keycount;
  auVar8._8_8_ = in_XMM2_Qa;
  auVar3._0_8_ = auVar2._0_8_ / dVar7;
  auVar3._8_8_ = auVar2._8_8_;
  if (auVar3._0_8_ < 0.0) {
    auVar4._0_8_ = sqrt(auVar3._0_8_);
    auVar4._8_56_ = extraout_var;
    auVar2 = auVar4._0_16_;
    auVar8._8_8_ = 0;
  }
  else {
    auVar2 = vsqrtsd_avx(auVar3,auVar3);
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar2._0_8_ * dVar7;
  auVar3 = vfmsub213sd_fma(auVar6,auVar2,auVar8);
  auVar2 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar8,auVar8);
  return 1.0 - (auVar2._0_8_ / auVar3._0_8_) / dVar7;
}

Assistant:

double calcScore ( const int * bins, const int bincount, const int keycount )
{
  double n = bincount;
  double k = keycount;

  // compute rms value

  double r = 0;

  for(int i = 0; i < bincount; i++)
  {
    double b = bins[i];

    r += b*b;
  }

  r = sqrt(r / n);

  // compute fill factor

  double f = (k*k - 1) / (n*r*r - k);

  // rescale to (0,1) with 0 = good, 1 = bad

  return 1 - (f / n);
}